

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,string *value)

{
  bool bVar1;
  uint32 *in_RDI;
  uint32 length;
  int in_stack_0000004c;
  string *in_stack_00000050;
  CodedInputStream *in_stack_00000058;
  undefined1 local_29;
  CodedInputStream *in_stack_ffffffffffffffe8;
  
  bVar1 = io::CodedInputStream::ReadVarint32(in_stack_ffffffffffffffe8,in_RDI);
  local_29 = false;
  if (bVar1) {
    local_29 = io::CodedInputStream::ReadString
                         (in_stack_00000058,in_stack_00000050,in_stack_0000004c);
  }
  return local_29;
}

Assistant:

bool WireFormatLite::ReadBytes(io::CodedInputStream* input,
                               std::string* value) {
  return ReadBytesToString(input, value);
}